

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-bench.cpp
# Opt level: O1

double __thiscall test::stdev_ts(test *this)

{
  ulong uVar1;
  long lVar2;
  pointer pdVar3;
  double *pdVar4;
  double dVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  double dVar9;
  double dVar10;
  int iVar13;
  undefined1 auVar11 [16];
  double dVar14;
  undefined1 auVar12 [16];
  vector<double,_std::allocator<double>_> local_20;
  
  get_ts(&local_20,this);
  uVar1 = (long)local_20.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_20.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start >> 3;
  dVar5 = 0.0;
  if (1 < uVar1) {
    dVar9 = 0.0;
    iVar13 = (int)((long)local_20.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)local_20.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start >> 0x23);
    pdVar4 = local_20.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (local_20.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start !=
        local_20.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_finish) {
      do {
        dVar9 = dVar9 + *pdVar4;
        pdVar4 = pdVar4 + 1;
      } while (pdVar4 != local_20.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_finish);
      auVar7._8_4_ = iVar13;
      auVar7._0_8_ = uVar1;
      auVar7._12_4_ = 0x45300000;
      dVar9 = dVar9 / ((auVar7._8_8_ - 1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0));
    }
    if (local_20.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start !=
        local_20.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_finish) {
      dVar5 = 0.0;
      pdVar3 = local_20.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      do {
        dVar5 = dVar5 + *pdVar3 * *pdVar3;
        pdVar3 = pdVar3 + 1;
      } while (pdVar3 != local_20.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_finish);
    }
    lVar2 = uVar1 - 1;
    auVar11._8_4_ = (int)((ulong)lVar2 >> 0x20);
    auVar11._0_8_ = lVar2;
    auVar11._12_4_ = 0x45300000;
    dVar10 = (double)CONCAT44(0x43300000,(int)lVar2) - 4503599627370496.0;
    dVar14 = auVar11._8_8_ - 1.9342813113834067e+25;
    auVar8._8_4_ = iVar13;
    auVar8._0_8_ = uVar1;
    auVar8._12_4_ = 0x45300000;
    auVar6._8_8_ = ((auVar8._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) * dVar9 * dVar9;
    auVar6._0_8_ = dVar5;
    auVar12._0_8_ = dVar10 + dVar14;
    auVar12._8_8_ = dVar10 + dVar14;
    auVar7 = divpd(auVar6,auVar12);
    dVar5 = auVar7._0_8_ - auVar7._8_8_;
    if (dVar5 < 0.0) {
      dVar5 = sqrt(dVar5);
    }
    else {
      dVar5 = SQRT(dVar5);
    }
  }
  if (local_20.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (double *)0x0) {
    operator_delete(local_20.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_20.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_20.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return dVar5;
}

Assistant:

double stdev_ts() const { return ::stdev(get_ts()); }